

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::MatchLiteralNode::BuildCharTrie
          (MatchLiteralNode *this,Compiler *compiler,CharTrie *trie,Node *cont,bool isAcceptFirst)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  CharTrie *this_00;
  undefined1 uVar5;
  uint uVar6;
  bool bVar7;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->isEquivClass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x469,"(!isEquivClass)","!isEquivClass");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar7 = this->length == 0;
  bVar2 = !bVar7;
  if (bVar7) {
    uVar5 = 0;
  }
  else {
    uVar5 = isAcceptFirst;
    if (trie->isAccepting == false) {
      uVar6 = 0;
      this_00 = trie;
      do {
        trie = CharTrie::Add(this_00,compiler->ctAllocator,
                             (compiler->program->rep).insts.litbuf.ptr[this->offset + uVar6]);
        if (0x10 < this_00->count) {
LAB_00eac56b:
          trie = this_00;
          uVar5 = 0;
          break;
        }
        uVar6 = uVar6 + 1;
        bVar2 = uVar6 < this->length;
        this_00 = trie;
        if (!bVar2) goto LAB_00eac56b;
      } while (trie->isAccepting == false);
    }
  }
  if (!bVar2) {
    if (cont == (Node *)0x0) {
      if (0 < trie->count) {
        return false;
      }
      trie->isAccepting = true;
    }
    else {
      iVar3 = (*cont->_vptr_Node[0x15])(cont,compiler,trie,0,isAcceptFirst);
      if ((char)iVar3 == '\0') {
        return false;
      }
    }
    uVar5 = 1;
  }
  return (bool)uVar5;
}

Assistant:

bool MatchLiteralNode::BuildCharTrie(Compiler& compiler, CharTrie* trie, Node* cont, bool isAcceptFirst) const
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(!isEquivClass);
        CharTrie* tail = trie;
        for (CharCount i = 0; i < length; i++)
        {
            if (tail->IsAccepting())
            {
                // An earlier literal is a prefix of this literal
                // If isAcceptFirst, can ignore suffix of already recognized literal.
                // Otherwise, must fail.
                return isAcceptFirst;
            }
            CharTrie* newTail = tail->Add(compiler.ctAllocator, compiler.program->rep.insts.litbuf[offset + i]);
            if (tail->Count() > maxTrieArmExpansion)
                return false;
            tail = newTail;
        }
        if (cont == 0)
        {
            if (tail->Count() > 0)
                // This literal is a proper prefix of an earlier literal
                return false;
            tail->SetAccepting();
        }
        else
        {
            if (!cont->BuildCharTrie(compiler, tail, 0, isAcceptFirst))
                return false;
        }
        return true;
    }